

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

ARKodeButcherTable ARKodeButcherTable_Alloc(int stages,int embedded)

{
  ARKodeButcherTable B;
  sunrealtype **ppsVar1;
  ulong uVar2;
  sunrealtype *psVar3;
  ulong __nmemb;
  
  if ((0 < stages) && (B = (ARKodeButcherTable)malloc(0x30), B != (ARKodeButcherTable)0x0)) {
    B->d = (sunrealtype *)0x0;
    B->c = (sunrealtype *)0x0;
    B->b = (sunrealtype *)0x0;
    B->stages = stages;
    __nmemb = (ulong)(uint)stages;
    ppsVar1 = (sunrealtype **)calloc(__nmemb,8);
    B->A = ppsVar1;
    if (ppsVar1 != (sunrealtype **)0x0) {
      for (uVar2 = 0; __nmemb != uVar2; uVar2 = uVar2 + 1) {
        B->A[uVar2] = (sunrealtype *)0x0;
      }
      uVar2 = 0;
      do {
        psVar3 = (sunrealtype *)calloc(__nmemb,8);
        if (__nmemb == uVar2) {
          B->b = psVar3;
          if (psVar3 == (sunrealtype *)0x0) break;
          psVar3 = (sunrealtype *)calloc(__nmemb,8);
          B->c = psVar3;
          if (psVar3 == (sunrealtype *)0x0) break;
          if (embedded != 0) {
            psVar3 = (sunrealtype *)calloc(__nmemb,8);
            B->d = psVar3;
            if (psVar3 == (sunrealtype *)0x0) break;
          }
          B->q = 0;
          B->p = 0;
          return B;
        }
        B->A[uVar2] = psVar3;
        ppsVar1 = B->A + uVar2;
        uVar2 = uVar2 + 1;
      } while (*ppsVar1 != (sunrealtype *)0x0);
    }
    ARKodeButcherTable_Free(B);
  }
  return (ARKodeButcherTable)0x0;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_Alloc(int stages, sunbooleantype embedded)
{
  int i;
  ARKodeButcherTable B;

  /* Check for legal 'stages' value */
  if (stages < 1) { return (NULL); }

  /* Allocate Butcher table structure */
  B = NULL;
  B = (ARKodeButcherTable)malloc(sizeof(struct ARKodeButcherTableMem));
  if (B == NULL) { return (NULL); }

  /* initialize pointers in B structure to NULL */
  B->A = NULL;
  B->b = NULL;
  B->c = NULL;
  B->d = NULL;

  /* set stages into B structure */
  B->stages = stages;

  /*
   * Allocate fields within Butcher table structure
   */

  /* allocate rows of A */
  B->A = (sunrealtype**)calloc(stages, sizeof(sunrealtype*));
  if (B->A == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  /* initialize each row of A to NULL */
  for (i = 0; i < stages; i++) { B->A[i] = NULL; }

  /* allocate columns of A */
  for (i = 0; i < stages; i++)
  {
    B->A[i] = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
    if (B->A[i] == NULL)
    {
      ARKodeButcherTable_Free(B);
      return (NULL);
    }
  }

  B->b = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
  if (B->b == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  B->c = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
  if (B->c == NULL)
  {
    ARKodeButcherTable_Free(B);
    return (NULL);
  }

  if (embedded)
  {
    B->d = (sunrealtype*)calloc(stages, sizeof(sunrealtype));
    if (B->d == NULL)
    {
      ARKodeButcherTable_Free(B);
      return (NULL);
    }
  }

  /* initialize order parameters */
  B->q = 0;
  B->p = 0;

  return (B);
}